

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Generator.hpp
# Opt level: O3

variant<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
* __thiscall
strq::Generator<std::variant<double,std::__cxx11::string,int>,void>::operator()
          (variant<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
           *__return_storage_ptr__,
          Generator<std::variant<double,std::__cxx11::string,int>,void> *this,
          Compound<strq::Arithmetic<std::normal_distribution<double>_>,_strq::Container<strq::Arithmetic<strq::detail::NoDistribution>_>,_strq::Arithmetic<std::uniform_int_distribution<int>_>_>
          *schema)

{
  _Tuple_impl<0UL,_strq::Arithmetic<std::normal_distribution<double>_>,_strq::Container<strq::Arithmetic<strq::detail::NoDistribution>_>,_strq::Arithmetic<std::uniform_int_distribution<int>_>_>
  *p_Var1;
  unsigned_long n;
  tuple<std::pair<strq::Generator<std::variant<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_void>::TypeWrapper<double>,_strq::Arithmetic<std::normal_distribution<double>_>_>,_std::pair<strq::Generator<std::variant<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_void>::TypeWrapper<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_strq::Container<strq::Arithmetic<strq::detail::NoDistribution>_>_>,_std::pair<strq::Generator<std::variant<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_void>::TypeWrapper<int>,_strq::Arithmetic<std::uniform_int_distribution<int>_>_>_>
  types_and_schemas;
  anon_class_8_1_91774365 assign_random;
  undefined1 local_90 [48];
  double dStack_60;
  double local_58;
  result_type rStack_50;
  undefined8 local_48;
  anon_class_8_1_91774365 local_40;
  double dStack_38;
  double dStack_30;
  result_type local_28;
  undefined8 uStack_20;
  
  n = Generator<unsigned_long,void>::operator()
                ((Generator<unsigned_long,void> *)local_90,
                 (Arithmetic<std::uniform_int_distribution<unsigned_long>_>)(ZEXT816(3) << 0x40));
  dStack_60 = (schema->_values).
              super__Tuple_impl<0UL,_strq::Arithmetic<std::normal_distribution<double>_>,_strq::Container<strq::Arithmetic<strq::detail::NoDistribution>_>,_strq::Arithmetic<std::uniform_int_distribution<int>_>_>
              .super__Head_base<0UL,_strq::Arithmetic<std::normal_distribution<double>_>,_false>.
              _M_head_impl._dist._M_param._M_mean;
  local_58 = (schema->_values).
             super__Tuple_impl<0UL,_strq::Arithmetic<std::normal_distribution<double>_>,_strq::Container<strq::Arithmetic<strq::detail::NoDistribution>_>,_strq::Arithmetic<std::uniform_int_distribution<int>_>_>
             .super__Head_base<0UL,_strq::Arithmetic<std::normal_distribution<double>_>,_false>.
             _M_head_impl._dist._M_param._M_stddev;
  rStack_50 = (schema->_values).
              super__Tuple_impl<0UL,_strq::Arithmetic<std::normal_distribution<double>_>,_strq::Container<strq::Arithmetic<strq::detail::NoDistribution>_>,_strq::Arithmetic<std::uniform_int_distribution<int>_>_>
              .super__Head_base<0UL,_strq::Arithmetic<std::normal_distribution<double>_>,_false>.
              _M_head_impl._dist._M_saved;
  p_Var1 = &(schema->_values).
            super__Tuple_impl<0UL,_strq::Arithmetic<std::normal_distribution<double>_>,_strq::Container<strq::Arithmetic<strq::detail::NoDistribution>_>,_strq::Arithmetic<std::uniform_int_distribution<int>_>_>
  ;
  local_48._0_1_ =
       (p_Var1->super__Head_base<0UL,_strq::Arithmetic<std::normal_distribution<double>_>,_false>).
       _M_head_impl._dist._M_saved_available;
  local_48._1_7_ =
       *(undefined7 *)
        &(p_Var1->super__Head_base<0UL,_strq::Arithmetic<std::normal_distribution<double>_>,_false>)
         ._M_head_impl._dist.field_0x19;
  local_90._24_8_ =
       *(undefined8 *)
        &(schema->_values).
         super__Tuple_impl<0UL,_strq::Arithmetic<std::normal_distribution<double>_>,_strq::Container<strq::Arithmetic<strq::detail::NoDistribution>_>,_strq::Arithmetic<std::uniform_int_distribution<int>_>_>
         .
         super__Tuple_impl<1UL,_strq::Container<strq::Arithmetic<strq::detail::NoDistribution>_>,_strq::Arithmetic<std::uniform_int_distribution<int>_>_>
         .
         super__Head_base<1UL,_strq::Container<strq::Arithmetic<strq::detail::NoDistribution>_>,_false>
         ._M_head_impl;
  local_90._32_8_ =
       (schema->_values).
       super__Tuple_impl<0UL,_strq::Arithmetic<std::normal_distribution<double>_>,_strq::Container<strq::Arithmetic<strq::detail::NoDistribution>_>,_strq::Arithmetic<std::uniform_int_distribution<int>_>_>
       .
       super__Tuple_impl<1UL,_strq::Container<strq::Arithmetic<strq::detail::NoDistribution>_>,_strq::Arithmetic<std::uniform_int_distribution<int>_>_>
       .
       super__Head_base<1UL,_strq::Container<strq::Arithmetic<strq::detail::NoDistribution>_>,_false>
       ._M_head_impl._size;
  local_90._4_8_ =
       (schema->_values).
       super__Tuple_impl<0UL,_strq::Arithmetic<std::normal_distribution<double>_>,_strq::Container<strq::Arithmetic<strq::detail::NoDistribution>_>,_strq::Arithmetic<std::uniform_int_distribution<int>_>_>
       .
       super__Tuple_impl<1UL,_strq::Container<strq::Arithmetic<strq::detail::NoDistribution>_>,_strq::Arithmetic<std::uniform_int_distribution<int>_>_>
       .super__Tuple_impl<2UL,_strq::Arithmetic<std::uniform_int_distribution<int>_>_>.
       super__Head_base<2UL,_strq::Arithmetic<std::uniform_int_distribution<int>_>,_false>.
       _M_head_impl._dist;
  local_90._40_8_ = local_40.variant;
  *(undefined8 *)
   &(__return_storage_ptr__->
    super__Variant_base<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
    ).super__Move_assign_alias<double,_std::__cxx11::basic_string<char>,_int>.
    super__Copy_assign_alias<double,_std::__cxx11::basic_string<char>,_int>.
    super__Move_ctor_alias<double,_std::__cxx11::basic_string<char>,_int>.
    super__Copy_ctor_alias<double,_std::__cxx11::basic_string<char>,_int>.
    super__Variant_storage_alias<double,_std::__cxx11::basic_string<char>,_int>._M_u = 0;
  (__return_storage_ptr__->
  super__Variant_base<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
  ).super__Move_assign_alias<double,_std::__cxx11::basic_string<char>,_int>.
  super__Copy_assign_alias<double,_std::__cxx11::basic_string<char>,_int>.
  super__Move_ctor_alias<double,_std::__cxx11::basic_string<char>,_int>.
  super__Copy_ctor_alias<double,_std::__cxx11::basic_string<char>,_int>.
  super__Variant_storage_alias<double,_std::__cxx11::basic_string<char>,_int>._M_index = '\0';
  local_40.variant = __return_storage_ptr__;
  dStack_38 = dStack_60;
  dStack_30 = local_58;
  local_28 = rStack_50;
  uStack_20 = local_48;
  operator()(&local_40,
             (tuple<std::pair<strq::Generator<std::variant<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_void>::TypeWrapper<double>,_strq::Arithmetic<std::normal_distribution<double>_>_>,_std::pair<strq::Generator<std::variant<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_void>::TypeWrapper<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_strq::Container<strq::Arithmetic<strq::detail::NoDistribution>_>_>,_std::pair<strq::Generator<std::variant<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_void>::TypeWrapper<int>,_strq::Arithmetic<std::uniform_int_distribution<int>_>_>_>
              *)local_90,n);
  return __return_storage_ptr__;
}

Assistant:

auto operator() (Schema&& schema) -> std::variant<Ts...>
        {
            static_assert(detail::trait::is_template_instantiation<Schema, Compound>,
                          "Schema for std::variant should be Compound");

            const auto choice = random<std::size_t> (
                    Arithmetic{std::uniform_int_distribution{std::size_t{0}, sizeof...(Ts)}}
            );

            const auto types = std::tuple {TypeWrapper<Ts>{}...};
            const auto types_and_schemas = detail::zip(types, schema.values());

            std::variant <Ts...> variant;

            const auto assign_random = [&] (const auto& type_and_schema) {
                variant = random <typename std::decay_t<decltype(type_and_schema.first)>::type> (type_and_schema.second);
            };

            invoke_with_nth_elem(assign_random, types_and_schemas, choice);
            return variant;
        }